

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void rc_init_minq_luts(void)

{
  init_minq_luts(kf_low_motion_minq_8,kf_high_motion_minq_8,arfgf_low_motion_minq_8,
                 arfgf_high_motion_minq_8,inter_minq_8,rtc_minq_8,AOM_BITS_8);
  init_minq_luts(kf_low_motion_minq_10,kf_high_motion_minq_10,arfgf_low_motion_minq_10,
                 arfgf_high_motion_minq_10,inter_minq_10,rtc_minq_10,AOM_BITS_10);
  init_minq_luts(kf_low_motion_minq_12,kf_high_motion_minq_12,arfgf_low_motion_minq_12,
                 arfgf_high_motion_minq_12,inter_minq_12,rtc_minq_12,AOM_BITS_12);
  return;
}

Assistant:

static void rc_init_minq_luts(void) {
  init_minq_luts(kf_low_motion_minq_8, kf_high_motion_minq_8,
                 arfgf_low_motion_minq_8, arfgf_high_motion_minq_8,
                 inter_minq_8, rtc_minq_8, AOM_BITS_8);
  init_minq_luts(kf_low_motion_minq_10, kf_high_motion_minq_10,
                 arfgf_low_motion_minq_10, arfgf_high_motion_minq_10,
                 inter_minq_10, rtc_minq_10, AOM_BITS_10);
  init_minq_luts(kf_low_motion_minq_12, kf_high_motion_minq_12,
                 arfgf_low_motion_minq_12, arfgf_high_motion_minq_12,
                 inter_minq_12, rtc_minq_12, AOM_BITS_12);
}